

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

Instr * __thiscall LinearScan::InsertLoad(LinearScan *this,Instr *instr,StackSym *sym,RegNum reg)

{
  code *pcVar1;
  IRType type_00;
  bool bVar2;
  IRType IVar3;
  uint uVar4;
  uint functionId;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  Instr *local_48;
  Instr *load;
  StackSym *oldSym;
  bool isMovSDZero;
  SymOpnd *pSStack_30;
  IRType type;
  Opnd *src;
  StackSym *pSStack_20;
  RegNum reg_local;
  StackSym *sym_local;
  Instr *instr_local;
  LinearScan *this_local;
  
  type_00 = StackSym::GetType(sym);
  oldSym._6_1_ = false;
  bVar2 = StackSym::IsConst(sym);
  if (bVar2) {
    bVar2 = StackSym::IsAllocated(sym);
    if ((bVar2) && (bVar2 = IsSymNonTempLocalVar(this,sym), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xc9b,"(!sym->IsAllocated() || IsSymNonTempLocalVar(sym))",
                         "!sym->IsAllocated() || IsSymNonTempLocalVar(sym)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pSStack_30 = (SymOpnd *)StackSym::GetConstOpnd(sym);
    if (pSStack_30 != (SymOpnd *)0x0) {
      IVar3 = StackSym::GetType(sym);
      pSStack_20 = StackSym::New(IVar3,this->func);
      *(uint *)&pSStack_20->field_0x18 = *(uint *)&pSStack_20->field_0x18 & 0xfffffff7 | 8;
      *(uint *)&pSStack_20->field_0x18 =
           *(uint *)&pSStack_20->field_0x18 & 0xffffffef | (*(uint *)&sym->field_0x18 >> 4 & 1) << 4
      ;
      *(uint *)&pSStack_20->field_0x18 =
           *(uint *)&pSStack_20->field_0x18 & 0xffffff7f | (*(uint *)&sym->field_0x18 >> 7 & 1) << 7
      ;
      *(uint *)&pSStack_20->field_0x18 =
           *(uint *)&pSStack_20->field_0x18 & 0xffffffdf | (*(uint *)&sym->field_0x18 >> 5 & 1) << 5
      ;
    }
    else {
      IVar3 = StackSym::GetType(sym);
      pSStack_20 = StackSym::New(IVar3,this->func);
      *(uint *)&pSStack_20->field_0x18 = *(uint *)&pSStack_20->field_0x18 & 0xfffffff7 | 8;
      *(uint *)&pSStack_20->field_0x18 = *(uint *)&pSStack_20->field_0x18 & 0xfffffeff | 0x100;
    }
    oldSym._6_1_ = pSStack_30 == (SymOpnd *)0x0;
  }
  else {
    pSStack_30 = IR::SymOpnd::New(&sym->super_Sym,type_00,this->func);
    pSStack_20 = sym;
  }
  if (oldSym._6_1_) {
    pRVar6 = IR::RegOpnd::New(pSStack_20,reg,type_00,this->func);
    local_48 = IR::Instr::New(MOVSD_ZERO,&pRVar6->super_Opnd,this->func);
    IR::Instr::InsertBefore(instr,local_48);
  }
  else {
    pRVar6 = IR::RegOpnd::New(pSStack_20,reg,type_00,this->func);
    local_48 = Lowerer::InsertMove(&pRVar6->super_Opnd,&pSStack_30->super_Opnd,instr,true);
  }
  IR::Instr::CopyNumber(local_48,instr);
  if (!oldSym._6_1_) {
    LinearScanMD::LegalizeUse(&this->linearScanMD,local_48,&pSStack_30->super_Opnd);
  }
  RecordLoopUse(this,(Lifetime *)0x0,reg);
  uVar4 = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,LinearScanPhase,uVar4,functionId);
  if (bVar2) {
    Output::Print(L"...Inserting load for ");
    Sym::Dump(&pSStack_20->super_Sym,ValueType::Uninitialized);
    if (pSStack_20->scratch == (anon_union_8_3_6c1fdb8e_for_scratch)0x0) {
      Output::Print(L"\n");
    }
    else {
      uVar4 = GetSpillCost(this,(Lifetime *)pSStack_20->scratch);
      Output::Print(L"  Cost:%d\n",(ulong)uVar4);
    }
  }
  return local_48;
}

Assistant:

IR::Instr*
LinearScan::InsertLoad(IR::Instr *instr, StackSym *sym, RegNum reg)
{
    IR::Opnd *src;
    // The size of loads and stores to memory need to match. See the comment
    // around type in InsertStore above.
    IRType type = sym->GetType();

    bool isMovSDZero = false;
    if (sym->IsConst())
    {
        Assert(!sym->IsAllocated() || IsSymNonTempLocalVar(sym));
        // For an intConst, reload the constant instead of using the stack.
        // Create a new StackSym to make sure the old sym remains singleDef
        src = sym->GetConstOpnd();
        if (!src)
        {
            isMovSDZero = true;
            sym = StackSym::New(sym->GetType(), this->func);
            sym->m_isConst = true;
            sym->m_isFltConst = true;
        }
        else
        {
            StackSym * oldSym = sym;
            sym = StackSym::New(sym->GetType(), this->func);
            sym->m_isConst = true;
            sym->m_isIntConst = oldSym->m_isIntConst;
            sym->m_isInt64Const = oldSym->m_isInt64Const;
            sym->m_isTaggableIntConst = oldSym->m_isTaggableIntConst;
        }
    }
    else
    {
        src = IR::SymOpnd::New(sym, type, this->func);
    }
    IR::Instr * load;
#if defined(_M_IX86) || defined(_M_X64)
    if (isMovSDZero)
    {
        load = IR::Instr::New(Js::OpCode::MOVSD_ZERO,
            IR::RegOpnd::New(sym, reg, type, this->func), this->func);
        instr->InsertBefore(load);
    }
    else
#endif
    {
        load = Lowerer::InsertMove(IR::RegOpnd::New(sym, reg, type, this->func), src, instr);
    }
    load->CopyNumber(instr);
    if (!isMovSDZero)
    {
        this->linearScanMD.LegalizeUse(load, src);
    }

    this->RecordLoopUse(nullptr, reg);

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        Output::Print(_u("...Inserting load for "));
        sym->Dump();
        if (sym->scratch.linearScan.lifetime)
        {
            Output::Print(_u("  Cost:%d\n"), this->GetSpillCost(sym->scratch.linearScan.lifetime));
        }
        else
        {
            Output::Print(_u("\n"));
        }
    }
#endif

    return load;
}